

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateConcatLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Rep *pRVar2;
  key_type *__k;
  string *psVar3;
  pointer pcVar4;
  bool bVar5;
  LayerUnion LVar6;
  LogMessage *pLVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  long *plVar10;
  long *plVar11;
  long lVar12;
  long lVar13;
  void **ppvVar14;
  Result r;
  string err;
  undefined1 local_178 [8];
  _Alloc_hider local_170;
  size_type local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  NeuralNetworkSpecValidator *local_150;
  mapped_type local_144;
  undefined1 local_140 [8];
  _Alloc_hider local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128 [2];
  undefined1 local_108 [56];
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_150 = this;
  Result::Result((Result *)local_178);
  validateInputCount((Result *)local_140,layer,2,-1);
  local_178 = local_140;
  std::__cxx11::string::operator=((string *)&local_170,(string *)&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_p != local_128) {
    operator_delete(local_138._M_p,local_128[0]._M_allocated_capacity + 1);
  }
  bVar5 = Result::good((Result *)local_178);
  if (bVar5) {
    validateOutputCount((Result *)local_140,layer,1,1);
    local_178 = local_140;
    std::__cxx11::string::operator=((string *)&local_170,(string *)&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_p != local_128) {
      operator_delete(local_138._M_p,local_128[0]._M_allocated_capacity + 1);
    }
  }
  bVar5 = Result::good((Result *)local_178);
  if ((bVar5) && (local_150->ndArrayInterpretation == true)) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Concat","");
    this_00 = &local_150->blobNameToRank;
    validateInputOutputRankEquality((Result *)local_140,layer,&local_90,this_00);
    local_178 = local_140;
    std::__cxx11::string::operator=((string *)&local_170,(string *)&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_p != local_128) {
      operator_delete(local_138._M_p,local_128[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    bVar5 = Result::good((Result *)local_178);
    if (bVar5) {
      if (layer->_oneof_case_[0] == 0x140) {
        LVar6 = layer->layer_;
      }
      else {
        LVar6.concat_ = Specification::ConcatLayerParams::default_instance();
      }
      if ((LVar6.mvn_)->acrosschannels_ == true) {
        local_108._0_8_ = local_108 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"Concat","");
        validateRankCount((Result *)local_140,layer,(string *)local_108,5,-1,this_00);
        local_178 = local_140;
        std::__cxx11::string::operator=((string *)&local_170,(string *)&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_p != local_128) {
          operator_delete(local_138._M_p,local_128[0]._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
          operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
        }
        bVar5 = Result::good((Result *)local_178);
      }
      else {
        local_108._0_8_ = local_108 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"Concat","");
        validateRankCount((Result *)local_140,layer,(string *)local_108,3,-1,this_00);
        local_178 = local_140;
        std::__cxx11::string::operator=((string *)&local_170,(string *)&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_p != local_128) {
          operator_delete(local_138._M_p,local_128[0]._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
          operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
        }
        bVar5 = Result::good((Result *)local_178);
      }
      if (bVar5 != false) {
        if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_108,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar7 = google::protobuf::internal::LogMessage::operator<<
                             ((LogMessage *)local_108,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_140,pLVar7);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_108);
        }
        iVar8 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::find(&this_00->_M_t,
                       (key_type *)((layer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
        local_150 = (NeuralNetworkSpecValidator *)
                    &(local_150->blobNameToRank)._M_t._M_impl.super__Rb_tree_header;
        if ((NeuralNetworkSpecValidator *)iVar8._M_node != local_150) {
          if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
            google::protobuf::internal::LogMessage::LogMessage
                      ((LogMessage *)local_140,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x5ca);
            pLVar7 = google::protobuf::internal::LogMessage::operator<<
                               ((LogMessage *)local_140,"CHECK failed: (index) < (current_size_): ")
            ;
            google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_d0,pLVar7);
            google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_140);
          }
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::at(this_00,(key_type *)
                                ((layer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
          pRVar2 = (layer->input_).super_RepeatedPtrFieldBase.rep_;
          ppvVar14 = pRVar2->elements;
          if (pRVar2 == (Rep *)0x0) {
            ppvVar14 = (void **)0x0;
          }
          lVar12 = (long)(layer->input_).super_RepeatedPtrFieldBase.current_size_;
          bVar5 = lVar12 == 0;
          if (!bVar5) {
            local_144 = *pmVar9;
            lVar13 = 0;
            do {
              __k = *(key_type **)((long)ppvVar14 + lVar13);
              iVar8 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::find(&this_00->_M_t,__k);
              if (((NeuralNetworkSpecValidator *)iVar8._M_node != local_150) &&
                 (pmVar9 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           ::at(this_00,__k), local_144 != *pmVar9)) {
                local_d0._M_string_length = 0;
                local_d0.field_2._M_local_buf[0] = '\0';
                psVar3 = (layer->name_).ptr_;
                pcVar4 = (psVar3->_M_dataplus)._M_p;
                local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
                local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_b0,pcVar4,pcVar4 + psVar3->_M_string_length);
                std::operator+(&local_70,"Layer \'",&local_b0);
                plVar10 = (long *)std::__cxx11::string::append((char *)&local_70);
                plVar11 = plVar10 + 2;
                if ((long *)*plVar10 == plVar11) {
                  local_40 = *plVar11;
                  lStack_38 = plVar10[3];
                  local_50 = &local_40;
                }
                else {
                  local_40 = *plVar11;
                  local_50 = (long *)*plVar10;
                }
                local_48 = plVar10[1];
                *plVar10 = (long)plVar11;
                plVar10[1] = 0;
                *(undefined1 *)(plVar10 + 2) = 0;
                std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_50);
                if (local_50 != &local_40) {
                  operator_delete(local_50,local_40 + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_70._M_dataplus._M_p != &local_70.field_2) {
                  operator_delete(local_70._M_dataplus._M_p,
                                  local_70.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                  operator_delete(local_b0._M_dataplus._M_p,
                                  local_b0.field_2._M_allocated_capacity + 1);
                }
                Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_d0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                  operator_delete(local_d0._M_dataplus._M_p,
                                  CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                           local_d0.field_2._M_local_buf[0]) + 1);
                }
                if (!bVar5) goto LAB_002db0d5;
                break;
              }
              lVar13 = lVar13 + 8;
              bVar5 = lVar12 * 8 == lVar13;
            } while (!bVar5);
          }
        }
      }
    }
  }
  __return_storage_ptr__->m_type = local_178._0_4_;
  __return_storage_ptr__->m_reason = local_178._4_4_;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_p == &local_160) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_160._M_allocated_capacity._1_7_,local_160._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_160._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_170._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_160._M_allocated_capacity._1_7_,local_160._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_168;
  local_168 = 0;
  local_160._M_local_buf[0] = '\0';
  local_170._M_p = (pointer)&local_160;
LAB_002db0d5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_p != &local_160) {
    operator_delete(local_170._M_p,
                    CONCAT71(local_160._M_allocated_capacity._1_7_,local_160._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateConcatLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 2, -1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Concat", blobNameToRank);
        if (!r.good()) {return r;}
        if (layer.concat().sequenceconcat()) {
            r = validateRankCount(layer, "Concat", 5, -1, blobNameToRank);
            if (!r.good()) {return r;}
        } else {
            r = validateRankCount(layer, "Concat", 3, -1, blobNameToRank);
            if (!r.good()) {return r;}
        }

        // check that all inputs have same rank
        int rank = 0;
        if (blobNameToRank.find(layer.input(0)) != blobNameToRank.end()) {
            rank = blobNameToRank.at(layer.input(0));
        } else {
            return r;
        }

        for (const auto& input : layer.input()) {
            if (blobNameToRank.find(input) != blobNameToRank.end()) {
                if (rank != blobNameToRank.at(input)) {
                    std::string err;
                    err = "Layer '" + std::string(layer.name()) + "' of type 'Concat' expects equal ranks for its inputs, but they are not equal.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
    }

    return r;
}